

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O0

void __thiscall Nes_Vrc6::run_saw(Nes_Vrc6 *this,cpu_time_t end_time)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  long in_RDI;
  int delta_1;
  int phase;
  int period;
  int delta;
  int last_amp;
  cpu_time_t time;
  int amp_step;
  int amp;
  Blip_Buffer *output;
  Vrc6_Osc *osc;
  Blip_Buffer *in_stack_ffffffffffffffa8;
  long lVar5;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_34;
  long local_30;
  uint local_24;
  
  if (*(long *)(in_RDI + 0x48) != 0) {
    local_24 = *(uint *)(in_RDI + 0x5c);
    bVar1 = ((Vrc6_Osc *)(in_RDI + 0x40))->regs[0];
    local_34 = *(int *)(in_RDI + 0x54);
    if (((*(byte *)(in_RDI + 0x42) & 0x80) == 0) || ((bVar1 & 0x3f) == 0 && local_24 == 0)) {
      *(undefined4 *)(in_RDI + 0x50) = 0;
      local_34 = (int)local_24 >> 3;
      Blip_Synth<2,_31>::offset
                ((Blip_Synth<2,_31> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
    }
    else {
      local_30 = (long)*(int *)(in_RDI + 0x50) + *(long *)(in_RDI + 0x60);
      if (local_30 < in_RSI) {
        lVar5 = in_RDI;
        iVar2 = Vrc6_Osc::period((Vrc6_Osc *)(in_RDI + 0x40));
        iVar2 = iVar2 << 1;
        iVar3 = *(int *)(in_RDI + 0x58);
        do {
          iVar3 = iVar3 + -1;
          if (iVar3 == 0) {
            iVar3 = 7;
            local_24 = 0;
          }
          iVar4 = ((int)local_24 >> 3) - local_34;
          if (iVar4 != 0) {
            Blip_Synth<2,_31>::offset
                      ((Blip_Synth<2,_31> *)CONCAT44(iVar2,iVar3),
                       CONCAT44(iVar4,in_stack_ffffffffffffffb8),(int)((ulong)lVar5 >> 0x20),
                       in_stack_ffffffffffffffa8);
            local_34 = (int)local_24 >> 3;
          }
          local_30 = iVar2 + local_30;
          local_24 = local_24 + (bVar1 & 0x3f) & 0xff;
        } while (local_30 < in_RSI);
        *(int *)(in_RDI + 0x58) = iVar3;
        *(uint *)(in_RDI + 0x5c) = local_24;
      }
      *(int *)(in_RDI + 0x50) = (int)local_30 - (int)in_RSI;
    }
    *(int *)(in_RDI + 0x54) = local_34;
  }
  return;
}

Assistant:

void Nes_Vrc6::run_saw( cpu_time_t end_time )
{
	Vrc6_Osc& osc = oscs [2];
	Blip_Buffer* output = osc.output;
	if ( !output )
		return;
	
	int amp = osc.amp;
	int amp_step = osc.regs [0] & 0x3F;
	cpu_time_t time = last_time;
	int last_amp = osc.last_amp;
	if ( !(osc.regs [2] & 0x80) || !(amp_step | amp) )
	{
		osc.delay = 0;
		int delta = (amp >> 3) - last_amp;
		last_amp = amp >> 3;
		saw_synth.offset( time, delta, output );
	}
	else
	{
		time += osc.delay;
		if ( time < end_time )
		{
			int period = osc.period() * 2;
			int phase = osc.phase;
			
			do
			{
				if ( --phase == 0 )
				{
					phase = 7;
					amp = 0;
				}
				
				int delta = (amp >> 3) - last_amp;
				if ( delta )
				{
					last_amp = amp >> 3;
					saw_synth.offset( time, delta, output );
				}
				
				time += period;
				amp = (amp + amp_step) & 0xFF;
			}
			while ( time < end_time );
			
			osc.phase = phase;
			osc.amp = amp;
		}
		
		osc.delay = time - end_time;
	}
	
	osc.last_amp = last_amp;
}